

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_pbkdf.c
# Opt level: O2

err_t beltPBKDF2(octet *key,octet *pwd,size_t pwd_len,size_t iter,octet *salt,size_t salt_len)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t state;
  long lVar3;
  err_t eVar4;
  octet *mac;
  bool bVar5;
  
  eVar4 = 0x6d;
  if (iter != 0) {
    bVar1 = memIsValid(pwd,pwd_len);
    if (bVar1 != 0) {
      bVar1 = memIsValid(salt,salt_len);
      if (bVar1 != 0) {
        bVar1 = memIsValid(key,0x20);
        if (bVar1 != 0) {
          sVar2 = beltHMAC_keep();
          state = blobCreate(sVar2 + 0x20);
          if (state == (blob_t)0x0) {
            eVar4 = 0x6e;
          }
          else {
            sVar2 = beltHMAC_keep();
            mac = (octet *)(sVar2 + (long)state);
            beltHMACStart(state,pwd,pwd_len);
            beltHMACStepA(salt,salt_len,state);
            key[0] = '\0';
            key[1] = '\0';
            key[2] = '\0';
            key[3] = '\x01';
            beltHMACStepA(key,4,state);
            beltHMACStepG(key,state);
            memCopy(mac,key,0x20);
            lVar3 = iter - 1;
            while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
              beltHMACStart(state,pwd,pwd_len);
              beltHMACStepA(mac,0x20,state);
              beltHMACStepG(mac,state);
              memXor2(key,mac,0x20);
            }
            blobClose(state);
            eVar4 = 0;
          }
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t beltPBKDF2(octet key[32], const octet pwd[], size_t pwd_len,
	size_t iter, const octet salt[], size_t salt_len)
{
	void* state;
	octet* t;
	// проверить входные данные
	if (iter == 0 ||
		!memIsValid(pwd, pwd_len) ||
		!memIsValid(salt, salt_len) ||
		!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltHMAC_keep() + 32);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	t = (octet*)state + beltHMAC_keep();
	// key <- HMAC(pwd, salt || 00000001)
	beltHMACStart(state, pwd, pwd_len);
	beltHMACStepA(salt, salt_len, state);
	*(u32*)key = 0, key[3] = 1;
	beltHMACStepA(key, 4, state);
	beltHMACStepG(key, state);
	// пересчитать key
	memCopy(t, key, 32);
	while (--iter)
	{
		beltHMACStart(state, pwd, pwd_len);
		beltHMACStepA(t, 32, state);
		beltHMACStepG(t, state);
		memXor2(key, t, 32);
	}
	// завершить
	blobClose(state);
	return ERR_OK;
}